

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O2

void zzMod(word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  ulong *puVar1;
  word *b_00;
  word *b_01;
  ulong uVar2;
  int iVar3;
  word wVar4;
  size_t shift;
  word wVar5;
  size_t sVar6;
  word *a_00;
  
  iVar3 = wwCmp2(a,n,b,m);
  if (iVar3 < 0) {
    stack = a;
    if (n <= m && m - n != 0) {
      wwSetZero(r + n,m - n);
      m = n;
    }
  }
  else {
    if (m == 1) {
      wVar4 = zzModW(a,n,*b);
      *r = wVar4;
      return;
    }
    b_00 = (word *)((long)stack + n * 8 + 8);
    b_01 = (word *)((long)stack + m * 8 + n * 8 + 8);
    wwCopy((word *)stack,a,n);
    b_00[-1] = 0;
    wwCopy(b_00,b,m);
    shift = u64CLZ(b[m - 1]);
    wwShHi((word *)stack,n + 1,shift);
    wwShHi(b_00,m,shift);
    a_00 = (word *)((long)stack + m * 8 + n * 8 + -8);
    for (sVar6 = n; m <= sVar6; sVar6 = sVar6 - 1) {
      puVar1 = (ulong *)((long)stack + sVar6 * 8);
      uVar2 = *(ulong *)((long)stack + m * 8 + n * 8);
      wVar4 = 0xffffffffffffffff;
      if (*puVar1 != uVar2) {
        wVar4 = __udivti3(puVar1[-1],*puVar1,uVar2,0);
      }
      wwCopy(b_01,a_00,2);
      wVar5 = zzMulW(b_01,b_01,2,wVar4);
      while( true ) {
        b_01[2] = wVar5;
        iVar3 = wwCmp2(b_01,3,puVar1 + -2,3);
        if (iVar3 < 1) break;
        wVar4 = wVar4 - 1;
        wVar5 = zzSub2(b_01,a_00,2);
        wVar5 = b_01[2] - wVar5;
      }
      wVar4 = zzSubMulW(puVar1 + -m,b_00,m,wVar4);
      uVar2 = *puVar1;
      *puVar1 = uVar2 - wVar4;
      if (CARRY8(uVar2 - wVar4,wVar4)) {
        wVar4 = zzAdd2(puVar1 + -m,b_00,m);
        *puVar1 = *puVar1 + wVar4;
      }
    }
    wwShLo((word *)stack,n + 1,shift);
  }
  wwCopy(r,(word *)stack,m);
  return;
}

Assistant:

void zzMod(word r[], const word a[], size_t n, const word b[], size_t m, void* stack)
{
	register dword qhat;
	register size_t shift;
	register word t;
	size_t i;
	// переменные в stack
	word* divident;		/*< нормализованное делимое (n + 1 слово) */
	word* divisor;		/*< нормализованный делитель (m слов) */
	word* mul;			/*< вспомогательное произведение (3 слова) */
	// pre
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// a < b?
	if (wwCmp2(a, n, b, m) < 0)
	{
		// r <- a
		if (n < m)
			wwSetZero(r + n, m - n), m = n;
		wwCopy(r, a, m);
		return;
	}
	// делим на одноразрядное число?
	if (m == 1)
	{
		r[0] = zzModW(a, n, b[0]);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	mul = divisor + m;
	stack = mul + 3;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация
	shift = wordCLZ(b[m - 1]);
	wwShHi(divident, n + 1, shift);
	wwShHi(divisor, m, shift);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// вычислить пробное частное
		if (divident[i] == divisor[m - 1])
			t = WORD_MAX;
		else
		{
			qhat = divident[i];
			qhat <<= B_PER_W;
			qhat |= divident[i - 1];
			qhat /= divisor[m - 1];
			t = (word)qhat;
		}
		// уточнить пробное частное
		wwCopy(mul, divisor + m - 2, 2);
		mul[2] = zzMulW(mul, mul, 2, t);
		while (wwCmp2(mul, 3, divident + i - 2, 3) > 0)
		{
			t--;
			mul[2] -= zzSub2(mul, divisor + m - 2, 2);
		}
		// учесть пробное частное
		t = zzSubMulW(divident + i - m, divisor, m, t);
		divident[i] -= t;
		if (divident[i] > (word)~t)
			// корректирующее сложение
			divident[i] += zzAdd2(divident + i - m, divisor, m);
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	t = 0, shift = 0, qhat = 0;
}